

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4m_video_source.h
# Opt level: O3

void __thiscall libaom_test::Y4mVideoSource::OpenSource(Y4mVideoSource *this)

{
  FILE *pFVar1;
  SEARCH_METHODS *message;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_30;
  AssertHelper local_28;
  internal local_20 [8];
  undefined8 *local_18;
  
  CloseSource(this);
  pFVar1 = OpenTestDataFile(&this->file_name_);
  this->input_file_ = pFVar1;
  local_30._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperNE<_IO_FILE*,decltype(nullptr)>
            (local_20,"input_file_","nullptr",&this->input_file_,&local_30._M_head_impl);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_30._M_head_impl + 0x10),"Input file open failed. Filename: ",0x22);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_30._M_head_impl + 0x10),(this->file_name_)._M_dataplus._M_p,
               (this->file_name_)._M_string_length);
    if (local_18 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (SEARCH_METHODS *)*local_18;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/y4m_video_source.h"
               ,0x27,(char *)message);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_30._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
  }
  if (local_18 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_18 != local_18 + 2) {
      operator_delete((undefined8 *)*local_18);
    }
    operator_delete(local_18);
  }
  return;
}

Assistant:

virtual void OpenSource() {
    CloseSource();
    input_file_ = OpenTestDataFile(file_name_);
    ASSERT_NE(input_file_, nullptr)
        << "Input file open failed. Filename: " << file_name_;
  }